

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O2

JointPolicyPureVectorForClusteredBG * __thiscall
JointPolicyPureVectorForClusteredBG::operator=
          (JointPolicyPureVectorForClusteredBG *this,JointPolicyDiscrete *o)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  undefined1 auVar2 [16];
  
  auVar2 = __dynamic_cast(o,&JointPolicyDiscrete::typeinfo,&typeinfo,0);
  if (auVar2._0_8_ != 0) {
    UNRECOVERED_JUMPTABLE =
         (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
         super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy
         [0x1a];
    iVar1 = (*UNRECOVERED_JUMPTABLE)(this,auVar2._0_8_,auVar2._8_8_,UNRECOVERED_JUMPTABLE);
    return (JointPolicyPureVectorForClusteredBG *)CONCAT44(extraout_var,iVar1);
  }
  __cxa_bad_cast();
}

Assistant:

JointPolicyPureVectorForClusteredBG& JointPolicyPureVectorForClusteredBG::operator= (const JointPolicyDiscrete& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "JointPolicyPureVectorForClusteredBG& JointPolicyPureVectorForClusteredBG::operator= (const JointPolicyDiscrete& o)  called" << endl;
#endif
    const JointPolicyPureVectorForClusteredBG& o2 = dynamic_cast
        <const JointPolicyPureVectorForClusteredBG& >(o);
    return(this->operator=(o2)) ;
}